

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

void __thiscall QListWidget::setCurrentRow(QListWidget *this,int row,SelectionFlags command)

{
  QItemSelectionModel *pQVar1;
  QListModel *pQVar2;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_FS_OFFSET;
  QListWidgetPrivate *d;
  undefined1 local_40 [24];
  undefined1 local_28 [28];
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  d_func((QListWidget *)0x89e1a3);
  pQVar1 = QPointer<QItemSelectionModel>::operator->((QPointer<QItemSelectionModel> *)0x89e1b9);
  pQVar2 = QListWidgetPrivate::listModel((QListWidgetPrivate *)0x89e1c8);
  QModelIndex::QModelIndex((QModelIndex *)0x89e1e3);
  (**(code **)(*(long *)pQVar2 + 0x60))(local_28,pQVar2,in_ESI,0,local_40);
  (**(code **)(*(long *)pQVar1 + 0x60))(pQVar1,local_28,local_c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidget::setCurrentRow(int row, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QListWidget);
    d->selectionModel->setCurrentIndex(d->listModel()->index(row), command);
}